

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O3

void __thiscall
Eigen::PermutationMatrix<-1,-1,int>::PermutationMatrix<Eigen::PermutationMatrix<_1,_1,int>>
          (PermutationMatrix<_1,_1,int> *this,
          InverseImpl<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::PermutationStorage> *other)

{
  ulong uVar1;
  long lVar2;
  void *pvVar3;
  undefined8 *puVar4;
  ulong uVar5;
  
  uVar1 = *(ulong *)(*(long *)other + 8);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  if (uVar1 == 0) {
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    if ((uVar1 >> 0x3e != 0) || (pvVar3 = malloc(uVar1 * 4), pvVar3 == (void *)0x0)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = std::streambuf::xsgetn;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    *(void **)this = pvVar3;
    *(ulong *)(this + 8) = uVar1;
    if (0 < (int)(uint)uVar1) {
      lVar2 = **(long **)other;
      uVar5 = 0;
      do {
        *(int *)((long)pvVar3 + (long)*(int *)(lVar2 + uVar5 * 4) * 4) = (int)uVar5;
        uVar5 = uVar5 + 1;
      } while (((uint)uVar1 & 0x7fffffff) != uVar5);
    }
  }
  return;
}

Assistant:

PermutationMatrix(const InverseImpl<Other,PermutationStorage>& other)
      : m_indices(other.derived().nestedExpression().size())
    {
      eigen_internal_assert(m_indices.size() <= NumTraits<StorageIndex>::highest());
      StorageIndex end = StorageIndex(m_indices.size());
      for (StorageIndex i=0; i<end;++i)
        m_indices.coeffRef(other.derived().nestedExpression().indices().coeff(i)) = i;
    }